

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpack-to-json.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  byte bVar1;
  bool bVar2;
  _Alloc_hider slice;
  size_type sVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  char cVar8;
  ostream *poVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  char *pcVar13;
  long lVar14;
  char *pcVar15;
  size_t i;
  size_type sVar16;
  int local_83c8;
  char *local_83c0;
  string s;
  string infile;
  Options local_8370;
  Dumper dumper;
  CharBufferSink sink;
  Buffer<char> buffer;
  ifstream ifs;
  size_type local_8238;
  int aiStack_8220 [122];
  ofstream ofs;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8028 [2047];
  
  local_83c8 = 1;
  bVar6 = false;
  bVar7 = true;
  bVar5 = true;
  bVar2 = true;
  pcVar15 = (char *)0x0;
  local_83c0 = (char *)0x0;
  for (lVar14 = 1; lVar14 < argc; lVar14 = lVar14 + 1) {
    pcVar13 = argv[lVar14];
    if (bVar2) {
      bVar4 = isOption(pcVar13,"--help");
      if (bVar4) {
        usage(argv);
        return 0;
      }
      bVar4 = isOption(pcVar13,"--pretty");
      if (bVar4) {
        bVar5 = true;
      }
      else {
        bVar4 = isOption(pcVar13,"--no-pretty");
        if (bVar4) {
          bVar5 = false;
        }
        else {
          bVar4 = isOption(pcVar13,"--print-unsupported");
          if (bVar4) {
            local_83c8 = 1;
          }
          else {
            bVar4 = isOption(pcVar13,"--no-print-unsupported");
            if (bVar4) {
              local_83c8 = 0;
            }
            else {
              bVar4 = isOption(pcVar13,"--hex");
              if (bVar4) {
                bVar6 = true;
              }
              else {
                bVar4 = isOption(pcVar13,"--validate");
                if (bVar4) {
                  bVar7 = true;
                }
                else {
                  bVar4 = isOption(pcVar13,"--no-validate");
                  if (!bVar4) {
                    bVar4 = isOption(pcVar13,"--");
                    if (!bVar4) goto LAB_001035a3;
                    bVar2 = false;
                    pcVar13 = local_83c0;
                    goto LAB_001035bd;
                  }
                  bVar7 = false;
                }
              }
            }
          }
        }
      }
      bVar2 = true;
      pcVar13 = local_83c0;
    }
    else {
LAB_001035a3:
      if ((local_83c0 != (char *)0x0) &&
         (bVar4 = pcVar15 != (char *)0x0, pcVar15 = pcVar13, pcVar13 = local_83c0, bVar4)) {
        usage(argv);
        return 1;
      }
    }
LAB_001035bd:
    local_83c0 = pcVar13;
  }
  pcVar13 = "-";
  if (local_83c0 != (char *)0x0) {
    pcVar13 = local_83c0;
  }
  if ((pcVar15 == (char *)0x0) || ((*pcVar15 == '+' && (pcVar15[1] == '\0')))) {
    pcVar15 = "/proc/self/fd/1";
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&infile,pcVar13,(allocator<char> *)&ofs);
  bVar4 = std::operator==(&infile,"-");
  if (bVar4) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (&infile,"/proc/self/fd/0");
  }
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  std::ifstream::ifstream(&ifs,(string *)&infile,_S_in);
  cVar8 = std::__basic_file<char>::is_open();
  if (cVar8 == '\0') {
    poVar9 = std::operator<<((ostream *)&std::cerr,"Cannot read infile \'");
    poVar9 = std::operator<<(poVar9,(string *)&infile);
    poVar9 = std::operator<<(poVar9,"\'");
    std::endl<char,std::char_traits<char>>(poVar9);
    iVar11 = 1;
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
              (&s,0x8000);
    while (*(int *)((long)aiStack_8220 + *(long *)(_ifs + -0x18)) == 0) {
      std::istream::read((char *)&ifs,(long)&ofs);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&s,(char *)&ofs,local_8238);
    }
    std::ifstream::close();
    if (bVar6) {
      _ofs = (pointer)local_8028;
      local_8028[0]._M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ofs,
                 s._M_string_length);
      sVar3 = s._M_string_length;
      iVar11 = -1;
      for (sVar16 = 0; sVar3 != sVar16; sVar16 = sVar16 + 1) {
        bVar1 = s._M_dataplus._M_p[sVar16];
        iVar10 = -1;
        if ((char)bVar1 < 0x30) goto LAB_001037c6;
        iVar12 = -0x30;
        if (bVar1 < 0x3a) {
LAB_00103786:
          iVar10 = iVar12 + (char)bVar1;
          if (iVar11 != -1) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ofs,
                      (char)iVar10 + (char)(iVar11 << 4));
            iVar10 = -1;
          }
        }
        else if (bVar1 < 0x61) {
          iVar12 = -0x37;
          iVar10 = -1;
          if ((byte)(bVar1 + 0xbf) < 6) goto LAB_00103786;
        }
        else {
          iVar12 = -0x57;
          iVar10 = -1;
          if (bVar1 < 0x67) goto LAB_00103786;
        }
LAB_001037c6:
        iVar11 = iVar10;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ofs);
      std::__cxx11::string::~string((string *)&ofs);
    }
    local_8370.paddingBehavior = Flexible;
    local_8370.attributeTranslator = (AttributeTranslator *)0x0;
    local_8370.customTypeHandler._0_5_ = 0;
    local_8370.customTypeHandler._5_3_ = 0;
    local_8370.buildUnindexedArrays = false;
    local_8370.buildUnindexedObjects = false;
    local_8370.singleLinePrettyPrint = false;
    local_8370.keepTopLevelOpen = false;
    local_8370.clearBuilderBeforeParse = true;
    local_8370.escapeForwardSlashes = false;
    local_8370.escapeControl = true;
    local_8370.escapeUnicode = false;
    local_8370.dumpAttributesInIndexOrder = true;
    local_8370.unsupportedDoublesAsString = false;
    local_8370.binaryAsHex = false;
    local_8370.datesAsIntegers = false;
    local_8370.disallowExternals = false;
    local_8370.disallowCustom = false;
    local_8370.disallowTags = false;
    local_8370.disallowBCD = false;
    local_8370.debugTags = false;
    local_8370.nestingLimit = 0xffffffff;
    local_8370.validateUtf8Strings = true;
    local_8370.checkAttributeUniqueness = true;
    local_8370.unsupportedTypeBehavior = FailOnUnsupportedType - local_83c8;
    local_8370.prettyPrint = bVar5;
    if (bVar7) {
      arangodb::velocypack::Validator::Validator((Validator *)&ofs,&local_8370);
      arangodb::velocypack::Validator::validate
                ((Validator *)&ofs,(uint8_t *)s._M_dataplus._M_p,s._M_string_length,false);
    }
    slice._M_p = s._M_dataplus._M_p;
    arangodb::velocypack::Buffer<char>::Buffer(&buffer,0x1000);
    sink.super_Sink._vptr_Sink = (_func_int **)&PTR__Sink_00117c48;
    sink._buffer = &buffer;
    arangodb::velocypack::Dumper::Dumper(&dumper,&sink.super_Sink,&local_8370);
    arangodb::velocypack::Dumper::dump(&dumper,(Slice)slice._M_p);
    std::ofstream::ofstream(&ofs,pcVar15,_S_out);
    cVar8 = std::__basic_file<char>::is_open();
    if (cVar8 == '\0') {
      poVar9 = std::operator<<((ostream *)&std::cerr,"Cannot write outfile \'");
      poVar9 = std::operator<<(poVar9,pcVar15);
      poVar9 = std::operator<<(poVar9,"\'");
      std::endl<char,std::char_traits<char>>(poVar9);
      iVar11 = 1;
    }
    else {
      if (!bVar2) {
        std::ostream::seekp(&ofs,0,0);
      }
      std::ostream::write((char *)&ofs,(long)buffer._buffer);
      std::ofstream::close();
      iVar11 = 0;
      if (!bVar2) {
        poVar9 = std::operator<<((ostream *)&std::cout,"Successfully converted JSON infile \'");
        poVar9 = std::operator<<(poVar9,(string *)&infile);
        poVar9 = std::operator<<(poVar9,"\'");
        std::endl<char,std::char_traits<char>>(poVar9);
        poVar9 = std::operator<<((ostream *)&std::cout,"VPack Infile size: ");
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        std::endl<char,std::char_traits<char>>(poVar9);
        poVar9 = std::operator<<((ostream *)&std::cout,"JSON Outfile size: ");
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        std::endl<char,std::char_traits<char>>(poVar9);
      }
    }
    std::ofstream::~ofstream(&ofs);
    arangodb::velocypack::Buffer<char>::~Buffer(&buffer);
  }
  std::ifstream::~ifstream(&ifs);
  std::__cxx11::string::~string((string *)&s);
  std::__cxx11::string::~string((string *)&infile);
  return iVar11;
}

Assistant:

int main(int argc, char* argv[]) {
  VELOCYPACK_GLOBAL_EXCEPTION_TRY

  char const* infileName = nullptr;
  char const* outfileName = nullptr;
  bool allowFlags = true;
  bool pretty = true;
  bool printUnsupported = true;
  bool hex = false;
  bool validate = true;

  int i = 1;
  while (i < argc) {
    char const* p = argv[i];
    if (allowFlags && isOption(p, "--help")) {
      usage(argv);
      return EXIT_SUCCESS;
    } else if (allowFlags && isOption(p, "--pretty")) {
      pretty = true;
    } else if (allowFlags && isOption(p, "--no-pretty")) {
      pretty = false;
    } else if (allowFlags && isOption(p, "--print-unsupported")) {
      printUnsupported = true;
    } else if (allowFlags && isOption(p, "--no-print-unsupported")) {
      printUnsupported = false;
    } else if (allowFlags && isOption(p, "--hex")) {
      hex = true;
    } else if (allowFlags && isOption(p, "--validate")) {
      validate = true;
    } else if (allowFlags && isOption(p, "--no-validate")) {
      validate = false;
    } else if (allowFlags && isOption(p, "--")) {
      allowFlags = false;
    } else if (infileName == nullptr) {
      infileName = p;
    } else if (outfileName == nullptr) {
      outfileName = p;
    } else {
      usage(argv);
      return EXIT_FAILURE;
    }
    ++i;
  }

#ifdef __linux__
  if (infileName == nullptr) {
    infileName = "-";
  }
#endif

  if (infileName == nullptr) {
    usage(argv);
    return EXIT_FAILURE;
  }

#ifdef __linux__
  // treat missing outfile as stdout
  bool toStdOut = false;
  if (outfileName == nullptr || strcmp(outfileName, "+") == 0) {
    outfileName = "/proc/self/fd/1";
    toStdOut = true;
  }
#else
  bool const toStdOut = false;
  if (outfileName == nullptr) {
    usage(argv);
    return EXIT_FAILURE;
  }
#endif

  // treat "-" as stdin
  std::string infile = infileName;
#ifdef __linux__
  if (infile == "-") {
    infile = "/proc/self/fd/0";
  }
#endif

  std::string s;
  std::ifstream ifs(infile, std::ifstream::in);

  if (!ifs.is_open()) {
    std::cerr << "Cannot read infile '" << infile << "'" << std::endl;
    return EXIT_FAILURE;
  }

  {
    char buffer[32768];
    s.reserve(sizeof(buffer));

    while (ifs.good()) {
      ifs.read(&buffer[0], sizeof(buffer));
      s.append(buffer, checkOverflow(ifs.gcount()));
    }
  }
  ifs.close();

  if (hex) {
    s = convertFromHex(s);
  }

  Options options;
  options.prettyPrint = pretty;
  options.checkAttributeUniqueness = true;
  options.validateUtf8Strings = true;
  options.unsupportedTypeBehavior =
      (printUnsupported ? Options::ConvertUnsupportedType
                        : Options::FailOnUnsupportedType);

  if (validate) {
    Validator validator(&options);
    validator.validate(reinterpret_cast<uint8_t const*>(s.data()), s.size(),
                       false);
  }

  Slice const slice(reinterpret_cast<uint8_t const*>(s.data()));

  Buffer<char> buffer(4096);
  CharBufferSink sink(&buffer);
  Dumper dumper(&sink, &options);

  try {
    dumper.dump(slice);
  } catch (Exception const& ex) {
    std::cerr << "An exception occurred while processing infile '" << infile
              << "': " << ex.what() << std::endl;
    return EXIT_FAILURE;
  } catch (...) {
    std::cerr << "An unknown exception occurred while processing infile '"
              << infile << "'" << std::endl;
    return EXIT_FAILURE;
  }

  std::ofstream ofs(outfileName, std::ofstream::out);

  if (!ofs.is_open()) {
    std::cerr << "Cannot write outfile '" << outfileName << "'" << std::endl;
    return EXIT_FAILURE;
  }

  // reset stream
  if (!toStdOut) {
    ofs.seekp(0);
  }

  // write into stream
  char const* start = buffer.data();
  ofs.write(start, buffer.size());

  ofs.close();

  if (!toStdOut) {
    std::cout << "Successfully converted JSON infile '" << infile << "'"
              << std::endl;
    std::cout << "VPack Infile size: " << s.size() << std::endl;
    std::cout << "JSON Outfile size: " << buffer.size() << std::endl;
  }

  VELOCYPACK_GLOBAL_EXCEPTION_CATCH
}